

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O2

CallInfo * growCI(lua_State *L)

{
  CallInfo *pCVar1;
  
  if (20000 < L->size_ci) {
    luaD_throw(L,5);
  }
  luaD_reallocCI(L,L->size_ci * 2);
  if (L->size_ci < 0x4e21) {
    pCVar1 = L->ci;
    L->ci = pCVar1 + 1;
    return pCVar1 + 1;
  }
  luaG_runerror(L,"stack overflow");
}

Assistant:

static CallInfo*growCI(lua_State*L){
if(L->size_ci>20000)
luaD_throw(L,5);
else{
luaD_reallocCI(L,2*L->size_ci);
if(L->size_ci>20000)
luaG_runerror(L,"stack overflow");
}
return++L->ci;
}